

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_>::NewKey
          (TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_> *this,
          FMD5Holder key)

{
  Node *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Node *pNVar4;
  uint uVar5;
  Node *pNVar6;
  uint uVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  
  pNVar4 = this->Nodes;
  uVar5 = this->Size - 1;
  uVar7 = uVar5 & key.Hash;
  pNVar9 = pNVar4 + uVar7;
  pNVar6 = pNVar9->Next;
  if (pNVar6 == (Node *)0x1) {
    pNVar9->Next = (Node *)0x0;
  }
  else {
    pNVar1 = this->LastFree;
    do {
      pNVar8 = pNVar1 + -1;
      pNVar10 = (Node *)0x0;
      if (pNVar1 <= pNVar4) break;
      pNVar10 = pNVar8;
      pNVar1 = pNVar8;
    } while (pNVar8->Next != (Node *)0x1);
    this->LastFree = pNVar8;
    if (pNVar10 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      pNVar4 = NewKey(this,key);
    }
    else {
      uVar5 = uVar5 & (pNVar9->Pair).Key.DWords[0];
      if (uVar5 == uVar7) {
        pNVar10->Next = pNVar6;
        pNVar4 = pNVar10;
        pNVar6 = pNVar10;
      }
      else {
        pNVar4 = pNVar4 + uVar5;
        do {
          pNVar6 = pNVar4;
          pNVar4 = pNVar6->Next;
        } while (pNVar4 != pNVar9);
        pNVar6->Next = pNVar10;
        *(undefined8 *)((pNVar10->Pair).Value.CompatFlags + 2) =
             *(undefined8 *)((pNVar9->Pair).Value.CompatFlags + 2);
        pNVar4 = pNVar9->Next;
        uVar2 = *(undefined8 *)&(pNVar9->Pair).Key;
        uVar3 = *(undefined8 *)(pNVar9->Pair).Value.CompatFlags;
        *(undefined8 *)((long)&(pNVar10->Pair).Key + 8) =
             *(undefined8 *)((long)&(pNVar9->Pair).Key + 8);
        *(undefined8 *)(pNVar10->Pair).Value.CompatFlags = uVar3;
        pNVar10->Next = pNVar4;
        *(undefined8 *)&(pNVar10->Pair).Key = uVar2;
        pNVar4 = (Node *)0x0;
        pNVar6 = pNVar9;
      }
      pNVar9->Next = pNVar4;
      pNVar9 = pNVar6;
    }
    if (pNVar10 == (Node *)0x0) {
      return pNVar4;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  *(long *)&(pNVar9->Pair).Key = key._0_8_;
  *(long *)((long)&(pNVar9->Pair).Key + 8) = key._8_8_;
  return pNVar9;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}